

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O0

exr_result_t exr_decoding_run(exr_const_context_t ctxt,int part_index,exr_decode_pipeline_t *decode)

{
  long lVar1;
  int iVar2;
  exr_result_t eVar3;
  ulong __n;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  size_t sampsize;
  exr_const_priv_part_t part;
  exr_result_t rv;
  undefined4 in_stack_00000020;
  uint in_stack_ffffffffffffffd8;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
    local_4 = 4;
  }
  else {
    lVar1 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
    if (in_RDX == 0) {
      local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,3);
    }
    else if ((*(long *)(in_RDX + 0x18) == in_RDI) && (*(int *)(in_RDX + 0x14) == in_ESI)) {
      if (*(long *)(in_RDX + 0xe8) == 0) {
        local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Decode pipeline has no read_fn declared");
      }
      else {
        iVar2 = (**(code **)(in_RDX + 0xe8))(in_RDX);
        if (iVar2 == 0) {
          eVar3 = update_pack_unpack_ptrs((exr_decode_pipeline_t *)(ulong)in_stack_ffffffffffffffd8)
          ;
          if (eVar3 == 0) {
            iVar2 = 0;
            if (*(long *)(in_RDX + 0xf0) != 0) {
              iVar2 = (**(code **)(in_RDX + 0xf0))(in_RDX);
            }
            if (iVar2 == 0) {
              if ((*(int *)(lVar1 + 4) == 2) || (*(int *)(lVar1 + 4) == 3)) {
                if ((*(int *)(lVar1 + 0xb0) == 0) &&
                   (*(long *)(in_RDX + 0xa8) != *(long *)(in_RDX + 0x98))) {
                  __n = (long)*(int *)(in_RDX + 0x30) * (long)*(int *)(in_RDX + 0x2c) * 4;
                  if ((*(ulong *)(in_RDX + 0xb0) < *(ulong *)(in_RDX + 0x58)) &&
                     (*(ulong *)(in_RDX + 0xb0) < __n)) {
                    return 1;
                  }
                  if (*(long *)(in_RDX + 0x58) == 0) {
                    memset(*(void **)(in_RDX + 0xa8),0,*(size_t *)(in_RDX + 0xb0));
                  }
                  else if (*(ulong *)(in_RDX + 0x58) < __n) {
                    memcpy(*(void **)(in_RDX + 0xa8),*(void **)(in_RDX + 0x98),
                           *(size_t *)(in_RDX + 0x58));
                    memset((void *)(*(long *)(in_RDX + 0xa8) +
                                   (*(ulong *)(in_RDX + 0x58) & 0xfffffffffffffffc)),0,
                           __n - *(long *)(in_RDX + 0x58));
                  }
                  else {
                    memcpy(*(void **)(in_RDX + 0xa8),*(void **)(in_RDX + 0x98),__n);
                  }
                }
                eVar3 = unpack_sample_table(ctxt,(exr_decode_pipeline_t *)
                                                 CONCAT44(part_index,in_stack_00000020));
                if ((*(ushort *)(in_RDX + 0x12) & 4) != 0) {
                  return eVar3;
                }
                if (eVar3 != 0) {
                  eVar3 = (**(code **)(in_RDI + 0x40))
                                    (in_RDI,eVar3,
                                     "Decode pipeline unable to unpack deep sample table");
                  return eVar3;
                }
              }
              iVar2 = 0;
              if (*(long *)(in_RDX + 0xf8) != 0) {
                iVar2 = (**(code **)(in_RDX + 0xf8))(in_RDX);
              }
              if (iVar2 == 0) {
                iVar2 = 0;
                if (*(long *)(in_RDX + 0x48) != 0) {
                  if (*(long *)(in_RDX + 0x100) != 0) {
                    iVar2 = (**(code **)(in_RDX + 0x100))(in_RDX);
                  }
                  if (iVar2 != 0) {
                    eVar3 = (**(code **)(in_RDI + 0x40))
                                      (in_RDI,iVar2,
                                       "Decode pipeline unable to unpack and convert data");
                    return eVar3;
                  }
                }
                local_4 = 0;
              }
              else {
                local_4 = (**(code **)(in_RDI + 0x40))
                                    (in_RDI,iVar2,
                                     "Decode pipeline unable to realloc deep sample table info");
              }
            }
            else {
              local_4 = (**(code **)(in_RDI + 0x40))
                                  (in_RDI,iVar2,"Decode pipeline unable to decompress data");
            }
          }
          else {
            local_4 = (**(code **)(in_RDI + 0x40))
                                (in_RDI,eVar3,
                                 "Decode pipeline unable to update pack / unpack pointers");
          }
        }
        else {
          local_4 = (**(code **)(in_RDI + 0x40))
                              (in_RDI,iVar2,"Unable to read pixel data block from context");
        }
      }
    }
    else {
      local_4 = (**(code **)(in_RDI + 0x40))
                          (in_RDI,3,
                           "Invalid request for decoding update from different context / part");
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_decoding_run (
    exr_const_context_t ctxt, int part_index, exr_decode_pipeline_t* decode)
{
    exr_result_t rv;
    exr_const_priv_part_t part;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;
    if (part_index < 0 || part_index >= ctxt->num_parts)
        return EXR_ERR_ARGUMENT_OUT_OF_RANGE;

    part = ctxt->parts[part_index];

    if (!decode) return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);

    if (decode->context != ctxt || decode->part_index != part_index)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for decoding update from different context / part");

    if (!decode->read_fn)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Decode pipeline has no read_fn declared");
    rv = decode->read_fn (decode);
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->report_error (
            ctxt, rv, "Unable to read pixel data block from context");

    if (rv == EXR_ERR_SUCCESS) rv = update_pack_unpack_ptrs (decode);
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->report_error (
            ctxt,
            rv,
            "Decode pipeline unable to update pack / unpack pointers");

    if (rv == EXR_ERR_SUCCESS && decode->decompress_fn)
        rv = decode->decompress_fn (decode);
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->report_error (
            ctxt, rv, "Decode pipeline unable to decompress data");

    if (rv == EXR_ERR_SUCCESS &&
        (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
         part->storage_mode == EXR_STORAGE_DEEP_TILED))
    {
        if (part->comp_type == EXR_COMPRESSION_NONE &&
            decode->sample_count_table != decode->packed_sample_count_table)
        {
            /* Check that uncompressed data can be copied in safely.
             *
             * underflow potentially happens when we're requested to
             * pack to 'individual' mode
             *
             * also occurs when working with deep tiled images, and
             * the tile size is smaller than the defined base tile
             * width / height. The way the data was written is in a
             * packed form, but the old writers would write a full
             * tile-size block of data. (compressed would be fine)
             */
            size_t sampsize =
                (((size_t) decode->chunk.width) * ((size_t) decode->chunk.height));
            sampsize *= sizeof (int32_t);

            if (decode->sample_count_alloc_size <
                decode->chunk.sample_count_table_size &&
                decode->sample_count_alloc_size < sampsize)
            {
                return EXR_ERR_OUT_OF_MEMORY;
            }

            if (decode->chunk.sample_count_table_size > 0)
            {
                if (decode->chunk.sample_count_table_size < sampsize)
                {
                    memcpy (
                        decode->sample_count_table,
                        decode->packed_sample_count_table,
                        decode->chunk.sample_count_table_size);
                    memset (
                        decode->sample_count_table + (decode->chunk.sample_count_table_size / sizeof(int32_t)),
                        0,
                        sampsize - decode->chunk.sample_count_table_size);
                }
                else
                {
                    memcpy (
                        decode->sample_count_table,
                        decode->packed_sample_count_table,
                        sampsize);
                }
            }
            else
            {
                memset (
                    decode->sample_count_table,
                    0,
                    decode->sample_count_alloc_size);
            }
        }

        rv = unpack_sample_table (ctxt, decode);

        if ((decode->decode_flags & EXR_DECODE_SAMPLE_DATA_ONLY)) return rv;

        if (rv != EXR_ERR_SUCCESS)
            return ctxt->report_error (
                ctxt, rv, "Decode pipeline unable to unpack deep sample table");
    }

    if (rv == EXR_ERR_SUCCESS && decode->realloc_nonimage_data_fn)
        rv = decode->realloc_nonimage_data_fn (decode);
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->report_error (
            ctxt,
            rv,
            "Decode pipeline unable to realloc deep sample table info");

    if (decode->chunk.unpacked_size > 0)
    {
        if (rv == EXR_ERR_SUCCESS && decode->unpack_and_convert_fn)
            rv = decode->unpack_and_convert_fn (decode);
        if (rv != EXR_ERR_SUCCESS)
            return ctxt->report_error (
                ctxt, rv, "Decode pipeline unable to unpack and convert data");
    }

    return rv;
}